

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O1

_Bool check_arguments(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,
                     inform_error *err)

{
  inform_error iVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  _Bool _Var7;
  bool bVar8;
  double dVar9;
  double dVar10;
  
  if (series != (int *)0x0) {
    if (l == 0) {
      iVar1 = INFORM_ENOSOURCES;
      goto LAB_001094b8;
    }
    if (n == 0) {
      iVar1 = INFORM_ENOINITS;
      goto LAB_001094b8;
    }
    if (m == 0) {
      iVar1 = INFORM_ESHORTSERIES;
      goto LAB_001094b8;
    }
    if (b == (int *)0x0) {
      iVar1 = INFORM_EBASE;
      goto LAB_001094b8;
    }
    if (r != (size_t *)0x0) {
      bVar6 = true;
      uVar2 = 1;
      if (s == (size_t *)0x0) {
        do {
          if (r[uVar2 - 1] == 0) goto LAB_00109494;
          if (m < r[uVar2 - 1]) goto LAB_00109526;
          bVar6 = uVar2 < l;
          bVar8 = uVar2 != l;
          uVar2 = uVar2 + 1;
        } while (bVar8);
      }
      else {
        do {
          if ((r[uVar2 - 1] == 0) && (s[uVar2 - 1] == 0)) goto LAB_00109494;
          if (m < r[uVar2 - 1] + s[uVar2 - 1]) goto LAB_00109526;
          bVar6 = uVar2 < l;
          bVar8 = uVar2 != l;
          uVar2 = uVar2 + 1;
        } while (bVar8);
      }
      goto LAB_0010953b;
    }
    dVar9 = 0.0;
    sVar4 = 0;
    do {
      if (b[sVar4] < 2) goto LAB_0010964b;
      dVar10 = log2((double)b[sVar4]);
      dVar9 = dVar9 + dVar10;
      sVar4 = sVar4 + 1;
    } while (l != sVar4);
    goto LAB_001095c2;
  }
  iVar1 = INFORM_ETIMESERIES;
LAB_001094b8:
  _Var7 = true;
  goto LAB_001094ba;
LAB_00109494:
  iVar1 = INFORM_EKZERO;
  goto LAB_0010952b;
LAB_0010964b:
  iVar1 = INFORM_EBASE;
  goto LAB_00109650;
LAB_00109526:
  iVar1 = INFORM_EKLONG;
LAB_0010952b:
  if (err != (inform_error *)0x0) {
    *err = iVar1;
  }
  _Var7 = true;
  if (!bVar6) {
LAB_0010953b:
    dVar9 = 0.0;
    lVar5 = 0;
    do {
      if (b[lVar5] < 2) goto LAB_0010964b;
      sVar4 = r[lVar5];
      dVar10 = log2((double)b[lVar5]);
      dVar9 = dVar9 + dVar10 * (((double)CONCAT44(0x45300000,(int)(sVar4 >> 0x20)) -
                                1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
      lVar5 = lVar5 + 1;
    } while (l + (l == 0) != lVar5);
LAB_001095c2:
    if (s != (size_t *)0x0) {
      lVar5 = 0;
      do {
        sVar4 = s[lVar5];
        dVar10 = log2((double)b[lVar5]);
        dVar9 = dVar9 + dVar10 * (((double)CONCAT44(0x45300000,(int)(sVar4 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
        lVar5 = lVar5 + 1;
      } while (l + (l == 0) != lVar5);
    }
    if (dVar9 <= 30.0) {
      lVar5 = m * n;
      _Var7 = true;
      uVar2 = 0;
      do {
        if (lVar5 != 0) {
          lVar3 = 0;
          do {
            if (series[lVar3] < 0) {
              iVar1 = INFORM_ENEGSTATE;
              goto LAB_001094ba;
            }
            if (b[uVar2] <= series[lVar3]) {
              iVar1 = INFORM_EBADSTATE;
              goto LAB_001094ba;
            }
            lVar3 = lVar3 + 1;
          } while (lVar5 - lVar3 != 0);
        }
        uVar2 = uVar2 + 1;
        _Var7 = uVar2 < l;
        series = series + lVar5;
      } while (uVar2 != l + (l == 0));
    }
    else {
      iVar1 = INFORM_EENCODE;
LAB_00109650:
      _Var7 = true;
LAB_001094ba:
      if (err != (inform_error *)0x0) {
        *err = iVar1;
      }
    }
  }
  return _Var7;
}

Assistant:

static bool check_arguments(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (series == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, true);
    }
    else if (n < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOINITS, true);
    }
    else if (m < 2)
    {
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, true);
    }
    else if (b < 2)
    {
        INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
    }
    else if (k == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
    }
    else if (m <= k)
    {
        INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
    }
    for (size_t i = 0; i < n * m; ++i)
    {
        if (series[i] < 0)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENEGSTATE, true);
        }
        else if (b <= series[i])
        {
            INFORM_ERROR_RETURN(err, INFORM_EBADSTATE, true);
        }
    }
    return false;
}